

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_clear(Tree *this)

{
  undefined8 *in_RDI;
  size_t i;
  basic_substring<const_char> local_38;
  basic_substring<const_char> bStack_28;
  undefined8 local_18;
  ulong local_10;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  basic_substring<char>::operator=((basic_substring<char> *)(in_RDI + 5),(nullptr_t)0x0);
  in_RDI[7] = 0;
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    basic_substring<const_char>::basic_substring(&local_38);
    basic_substring<const_char>::basic_substring(&bStack_28);
    local_18 = 0;
    memcpy(in_RDI + local_10 * 5 + 0xc,&local_38,0x28);
  }
  return;
}

Assistant:

void Tree::_clear()
{
    m_buf = nullptr;
    m_cap = 0;
    m_size = 0;
    m_free_head = 0;
    m_free_tail = 0;
    m_arena = {};
    m_arena_pos = 0;
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = {};
}